

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall QPDFTokenizer::Token::Token(Token *this,token_type_e type,string *value)

{
  pointer pcVar1;
  QPDFObjectHandle local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  string local_50;
  
  this->type = type;
  local_58 = &this->value;
  local_60 = &(this->value).field_2;
  (this->value)._M_dataplus._M_p = (pointer)local_60;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + value->_M_string_length);
  (this->raw_value)._M_dataplus._M_p = (pointer)&(this->raw_value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->raw_value,pcVar1,pcVar1 + value->_M_string_length);
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  if (type == tt_name) {
    QPDFObjectHandle::newName(&local_70,value);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_50,&local_70);
  }
  else {
    if (type != tt_string) {
      return;
    }
    QPDFObjectHandle::newString(&local_70,value);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_50,&local_70);
  }
  std::__cxx11::string::operator=((string *)&this->raw_value,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

QPDFTokenizer::Token::Token(token_type_e type, std::string const& value) :
    type(type),
    value(value),
    raw_value(value)
{
    if (type == tt_string) {
        raw_value = QPDFObjectHandle::newString(value).unparse();
    } else if (type == tt_name) {
        raw_value = QPDFObjectHandle::newName(value).unparse();
    }
}